

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_csr.c
# Opt level: O3

int mbedtls_x509_csr_info(char *buf,size_t size,char *prefix,mbedtls_x509_csr *csr)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  char *name;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  ulong __maxlen;
  char key_size_str [14];
  char local_3e [14];
  
  uVar1 = snprintf(buf,size,"%sCSR version   : %d",prefix,(ulong)(uint)csr->version);
  if (-1 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
    uVar6 = size - uVar3;
    if (uVar3 <= size && uVar6 != 0) {
      pcVar5 = buf + uVar3;
      uVar1 = snprintf(pcVar5,uVar6,"\n%ssubject name  : ",prefix);
      if (-1 < (int)uVar1) {
        uVar3 = (ulong)uVar1;
        uVar7 = uVar6 - uVar3;
        if (uVar3 <= uVar6 && uVar7 != 0) {
          pcVar5 = pcVar5 + uVar3;
          uVar1 = mbedtls_x509_dn_gets(pcVar5,uVar7,&csr->subject);
          if (-1 < (int)uVar1) {
            uVar3 = (ulong)uVar1;
            uVar6 = uVar7 - uVar3;
            if (uVar3 <= uVar7 && uVar6 != 0) {
              pcVar5 = pcVar5 + uVar3;
              uVar1 = snprintf(pcVar5,uVar6,"\n%ssigned using  : ",prefix);
              if (-1 < (int)uVar1) {
                uVar3 = (ulong)uVar1;
                uVar7 = uVar6 - uVar3;
                if (uVar3 <= uVar6 && uVar7 != 0) {
                  uVar1 = mbedtls_x509_sig_alg_gets
                                    (pcVar5 + uVar3,uVar7,&csr->sig_oid,csr->sig_pk,csr->sig_md,
                                     csr->sig_opts);
                  if (-1 < (int)uVar1) {
                    uVar6 = (ulong)uVar1;
                    __maxlen = uVar7 - uVar6;
                    if (uVar6 <= uVar7 && __maxlen != 0) {
                      name = mbedtls_pk_get_name(&csr->pk);
                      iVar2 = mbedtls_x509_key_size_helper(local_3e,0xe,name);
                      if (iVar2 != 0) {
                        return iVar2;
                      }
                      sVar4 = mbedtls_pk_get_bitlen(&csr->pk);
                      uVar1 = snprintf(pcVar5 + uVar3 + uVar6,__maxlen,"\n%s%-14s: %d bits\n",prefix
                                       ,local_3e,sVar4 & 0xffffffff);
                      if (-1 < (int)uVar1) {
                        if (__maxlen <= uVar1) {
                          return -0x2980;
                        }
                        return uVar1 + ((int)size - (int)__maxlen);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return -0x2980;
}

Assistant:

int mbedtls_x509_csr_info( char *buf, size_t size, const char *prefix,
                   const mbedtls_x509_csr *csr )
{
    int ret;
    size_t n;
    char *p;
    char key_size_str[BEFORE_COLON];

    p = buf;
    n = size;

    ret = mbedtls_snprintf( p, n, "%sCSR version   : %d",
                               prefix, csr->version );
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_snprintf( p, n, "\n%ssubject name  : ", prefix );
    MBEDTLS_X509_SAFE_SNPRINTF;
    ret = mbedtls_x509_dn_gets( p, n, &csr->subject );
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_snprintf( p, n, "\n%ssigned using  : ", prefix );
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_x509_sig_alg_gets( p, n, &csr->sig_oid, csr->sig_pk, csr->sig_md,
                             csr->sig_opts );
    MBEDTLS_X509_SAFE_SNPRINTF;

    if( ( ret = mbedtls_x509_key_size_helper( key_size_str, BEFORE_COLON,
                                      mbedtls_pk_get_name( &csr->pk ) ) ) != 0 )
    {
        return( ret );
    }

    ret = mbedtls_snprintf( p, n, "\n%s%-" BC "s: %d bits\n", prefix, key_size_str,
                          (int) mbedtls_pk_get_bitlen( &csr->pk ) );
    MBEDTLS_X509_SAFE_SNPRINTF;

    return( (int) ( size - n ) );
}